

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.h
# Opt level: O0

void __thiscall cmMakefile::AddTestGenerator(cmMakefile *this,cmTestGenerator *g)

{
  cmTestGenerator *local_18;
  cmTestGenerator *g_local;
  cmMakefile *this_local;
  
  if (g != (cmTestGenerator *)0x0) {
    local_18 = g;
    g_local = (cmTestGenerator *)this;
    std::vector<cmTestGenerator_*,_std::allocator<cmTestGenerator_*>_>::push_back
              (&this->TestGenerators,&local_18);
  }
  return;
}

Assistant:

void AddTestGenerator(cmTestGenerator* g)
  {
    if (g) {
      this->TestGenerators.push_back(g);
    }
  }